

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Str.cpp
# Opt level: O3

void __thiscall mbc::Val::Str::Str(Str *this)

{
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar1;
  string *psVar2;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  _ValAtom::_ValAtom(&this->super__ValAtom);
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)&PTR__Str_0013f948;
  psVar2 = (string *)operator_new(0x20);
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  psVar2->_M_string_length = 0;
  (psVar2->field_2)._M_local_buf[0] = '\0';
  this->value_ = psVar2;
  pfVar1 = (this->super__ValAtom).vaild_checker_;
  local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pfVar1->super__Function_base)._M_functor;
  local_48._8_8_ = *(undefined8 *)((long)&(pfVar1->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pfVar1->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pfVar1->super__Function_base)._M_functor + 8) = 0;
  local_38 = (pfVar1->super__Function_base)._M_manager;
  (pfVar1->super__Function_base)._M_manager =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Str.cpp:27:24)>
       ::_M_manager;
  local_30 = pfVar1->_M_invoker;
  pfVar1->_M_invoker =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Str.cpp:27:24)>
       ::_M_invoke;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  psVar2 = (this->super__ValAtom).super_ValBase.invaild_waring_;
  std::__cxx11::string::_M_replace((ulong)psVar2,0,(char *)psVar2->_M_string_length,0x131290);
  *(this->super__ValAtom).super_ValBase.type_ = STR;
  local_48._M_unused._M_object = &local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,anon_var_dwarf_6c742 + 0xb79);
  _ValAtom::set(&this->super__ValAtom,(string *)&local_48);
  if ((_Manager_type *)local_48._M_unused._0_8_ != &local_38) {
    operator_delete(local_48._M_unused._M_object);
  }
  return;
}

Assistant:

Str::Str() {
    value_           = new string();

    *vaild_checker_  = [](const string& str){return true;};
    *invaild_waring_ = "[invaild str]";
    *type_           = Type(STR);

    set("");
}